

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall libcellml::Importer::resolveImports(Importer *this,ModelPtr *model,string *basePath)

{
  IssueImpl *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  LoggerImpl *pLVar3;
  ImporterImpl *pIVar4;
  bool bVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  Logger local_a0;
  IssuePtr issue;
  string normalisedBasePath;
  History history;
  
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  history.
  super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar3 = Logger::pFunc(&this->super_Logger);
  Logger::LoggerImpl::removeAllIssues(pLVar3);
  if ((model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    this_00 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              mPimpl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&normalisedBasePath,"Cannot resolve imports for null model.",
               (allocator<char> *)&local_a0);
    Issue::IssueImpl::setDescription(this_00,&normalisedBasePath);
    std::__cxx11::string::~string((string *)&normalisedBasePath);
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORTER_NULL_MODEL);
    pLVar3 = Logger::pFunc(&this->super_Logger);
    Logger::LoggerImpl::addIssue(pLVar3,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar5 = false;
  }
  else {
    clearImports((Importer *)pLVar3,model);
    normalisePath(&normalisedBasePath,basePath);
    std::__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Model,void>
              ((__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
               &model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
    getImportedUnits((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                      *)&issue,(ModelConstPtr *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0.mPimpl);
    _Var1 = issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    bVar5 = true;
    for (p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 != _Var1._M_pi; p_Var6 = p_Var6 + 1) {
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::clear(&history);
      pIVar4 = (ImporterImpl *)Logger::pFunc(&this->super_Logger);
      bVar2 = ImporterImpl::fetchUnits(pIVar4,(UnitsPtr *)p_Var6,&normalisedBasePath,&history);
      if (!bVar2) {
        Logger::issueCount(&this->super_Logger);
        Logger::issue(&local_a0,(size_t)this);
        AnyCellmlElement::AnyCellmlElementImpl::setUnits
                  ((AnyCellmlElementImpl *)**(undefined8 **)(local_a0._vptr_Logger[1] + 0x28),
                   (UnitsPtr *)p_Var6);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0.mPimpl);
        bVar5 = false;
      }
    }
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)&issue);
    std::__shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libcellml::Model,void>
              ((__shared_ptr<libcellml::ComponentEntity_const,(__gnu_cxx::_Lock_policy)2> *)
               &local_a0,&model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
    getImportedComponents
              ((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                *)&issue,(ComponentEntityConstPtr *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0.mPimpl);
    for (p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var6 != issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi; p_Var6 = p_Var6 + 1) {
      std::
      vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      ::clear(&history);
      pIVar4 = (ImporterImpl *)Logger::pFunc(&this->super_Logger);
      bVar2 = ImporterImpl::fetchComponent
                        (pIVar4,(ComponentPtr *)p_Var6,&normalisedBasePath,&history);
      if (!bVar2) {
        Logger::issueCount(&this->super_Logger);
        Logger::issue(&local_a0,(size_t)this);
        AnyCellmlElement::AnyCellmlElementImpl::setComponent
                  ((AnyCellmlElementImpl *)**(undefined8 **)(local_a0._vptr_Logger[1] + 0x28),
                   (ComponentPtr *)p_Var6,COMPONENT);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0.mPimpl);
        bVar5 = false;
      }
    }
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               *)&issue);
    std::__cxx11::string::~string((string *)&normalisedBasePath);
  }
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::~vector(&history);
  return bVar5;
}

Assistant:

bool Importer::resolveImports(ModelPtr &model, const std::string &basePath)
{
    bool status = true;
    History history;

    pFunc()->removeAllIssues();

    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Cannot resolve imports for null model.");
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        pFunc()->addIssue(issue);
        return false;
    }

    clearImports(model);
    auto normalisedBasePath = normalisePath(basePath);

    for (const UnitsPtr &units : getImportedUnits(model)) {
        history.clear();
        if (!pFunc()->fetchUnits(units, normalisedBasePath, history)) {
            // Get the last issue recorded and change its object to be the top-level importing item.
            issue(issueCount() - 1)->mPimpl->mItem->mPimpl->setUnits(units);
            status = false;
        }
    }

    for (const ComponentPtr &component : getImportedComponents(model)) {
        history.clear();
        if (!pFunc()->fetchComponent(component, normalisedBasePath, history)) {
            issue(issueCount() - 1)->mPimpl->mItem->mPimpl->setComponent(component);
            status = false;
        }
    }

    return status;
}